

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::setup_peer_class(torrent *this)

{
  int iVar1;
  peer_class_t pVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_38;
  
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x32])();
  name_abi_cxx11_(&local_38,this);
  pVar2 = peer_class_pool::new_peer_class((peer_class_pool *)CONCAT44(extraout_var,iVar1),&local_38)
  ;
  (this->m_peer_class).m_val = pVar2.m_val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x32])();
  peer_class_set::add_class
            (&this->super_peer_class_set,(peer_class_pool *)CONCAT44(extraout_var_00,iVar1),
             (peer_class_t)(this->m_peer_class).m_val);
  return;
}

Assistant:

void torrent::setup_peer_class()
	{
		TORRENT_ASSERT(m_peer_class == peer_class_t{0});
		m_peer_class = m_ses.peer_classes().new_peer_class(name());
		add_class(m_ses.peer_classes(), m_peer_class);
	}